

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O2

int TPJobInit(ThreadPoolJob *job,start_routine func,void *arg)

{
  if (func != (start_routine)0x0 && job != (ThreadPoolJob *)0x0) {
    job->func = func;
    job->arg = arg;
    job->priority = MED_PRIORITY;
    job->free_func = (free_routine)0x0;
    return 0;
  }
  return 0x16;
}

Assistant:

int TPJobInit(ThreadPoolJob *job, start_routine func, void *arg)
{
	if (!job || !func)
		return EINVAL;
	job->func = func;
	job->arg = arg;
	job->priority = DEFAULT_PRIORITY;
	job->free_func = DEFAULT_FREE_ROUTINE;

	return 0;
}